

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O1

int __thiscall
nsync::nsync_mu_wait_with_deadline
          (nsync *this,nsync_mu *mu,_func_int_void_ptr *condition,void *condition_arg,
          _func_int_void_ptr_void_ptr *condition_arg_eq,nsync_time abs_deadline,
          nsync_note cancel_note)

{
  nsync_dll_element_ *pnVar1;
  int iVar2;
  uint uVar3;
  __int_type _Var4;
  lock_type *l_type;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint attempts;
  undefined **ppuVar8;
  waiter *w;
  nsync_dll_element_ *pnVar9;
  nsync_dll_list_ pnVar10;
  uint32_t uVar11;
  nsync_note cancel_note_00;
  bool bVar12;
  uint uVar13;
  bool bVar14;
  nsync_time abs_deadline_00;
  int local_6c;
  
  uVar7 = *(uint *)this;
  cancel_note_00 = (nsync_note)condition_arg_eq;
  if ((uVar7 & 0xffffff01) == 0) {
    nsync_panic_("nsync_mu not held in some mode when calling nsync_mu_wait_with_deadline()\n");
  }
  if (uVar7 < 0x100) {
    ppuVar8 = &nsync_writer_type_;
  }
  else {
    ppuVar8 = &nsync_reader_type_;
  }
  if (mu != (nsync_mu *)0x0) {
    l_type = (lock_type *)*ppuVar8;
    iVar5 = (*(code *)mu)(condition);
    if (iVar5 == 0) {
      bVar12 = false;
      w = (waiter *)0x0;
LAB_00105dc7:
      if (w == (waiter *)0x0) {
        w = nsync_waiter_new_();
      }
      w->cv_mu = (nsync_mu_s_ *)0x0;
      w->l_type = l_type;
      (w->cond).f = (_func_int_void_ptr *)mu;
      (w->cond).v = condition;
      (w->cond).eq = (_func_int_void_ptr_void_ptr *)condition_arg;
      (w->nw).waiting.super___atomic_base<unsigned_int>._M_i = 1;
      _Var4 = (w->remove_count).super___atomic_base<unsigned_int>._M_i;
      uVar6 = nsync_spin_test_and_set_
                        ((nsync_atomic_uint32_ *)this,2,(uint)(mu != (nsync_mu *)0x0) << 4 | 6,0x80)
      ;
      if (bVar12) {
        pnVar1 = &(w->nw).q;
        pnVar9 = nsync_dll_first_(*(nsync_dll_list_ *)(this + 8));
        nsync_maybe_merge_conditions_(pnVar1,pnVar9);
        pnVar10 = nsync_dll_make_first_in_list_(*(nsync_dll_list_ *)(this + 8),pnVar1);
      }
      else {
        pnVar9 = nsync_dll_last_(*(nsync_dll_list_ *)(this + 8));
        pnVar1 = &(w->nw).q;
        nsync_maybe_merge_conditions_(pnVar9,pnVar1);
        pnVar10 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(this + 8),pnVar1);
      }
      *(nsync_dll_list_ *)(this + 8) = pnVar10;
      do {
        iVar5 = *(int *)this;
        uVar11 = 0;
        if ((iVar5 - l_type->add_to_acquire & 0xffffff01) != 0 || (uVar6 & 0xc) != 4) {
          uVar11 = l_type->add_to_acquire;
        }
        LOCK();
        iVar2 = *(int *)this;
        if (iVar5 == iVar2) {
          *(uint32_t *)this = iVar5 - uVar11 & 0xfffffffd;
        }
        UNLOCK();
      } while (iVar5 != iVar2);
      if (uVar11 == 0) {
        nsync_mu_unlock_slow_((nsync_mu *)this,l_type);
      }
      if ((w->nw).waiting.super___atomic_base<unsigned_int>._M_i != 0) {
        bVar12 = false;
        uVar7 = 0;
        iVar5 = 0;
        local_6c = 0;
LAB_00105eff:
        if (iVar5 == 0) {
          abs_deadline_00.tv_nsec = abs_deadline.tv_sec;
          abs_deadline_00.tv_sec = (__time_t)cancel_note;
          iVar5 = nsync_sem_wait_with_cancel_
                            ((nsync *)w,(waiter *)condition_arg_eq,abs_deadline_00,cancel_note_00);
          if (iVar5 == 0) {
            iVar5 = 0;
          }
          else if ((w->nw).waiting.super___atomic_base<unsigned_int>._M_i != 0) {
            attempts = 0;
            do {
              uVar13 = *(uint *)this;
              if ((uVar13 & 0xffffff43) == 0) {
                LOCK();
                uVar3 = *(uint *)this;
                if (uVar13 == uVar3) {
                  *(uint *)this = uVar13 & 0x9c | 3;
                }
                UNLOCK();
                if (uVar13 == uVar3) goto LAB_00105fa2;
              }
              if ((uVar13 & 0x22) == 0) {
                LOCK();
                if (uVar13 == *(uint *)this) {
                  *(uint *)this = uVar13 | 0x20;
                }
                UNLOCK();
              }
              attempts = nsync_spin_delay_(attempts);
            } while( true );
          }
        }
        goto LAB_00105f03;
      }
      bVar12 = true;
      local_6c = 0;
      goto LAB_00106016;
    }
  }
  w = (waiter *)0x0;
  iVar5 = 0;
LAB_00106065:
  if (w != (waiter *)0x0) {
    nsync_waiter_free_(w);
  }
  return iVar5;
LAB_00105fa2:
  bVar12 = false;
  if (((w->nw).waiting.super___atomic_base<unsigned_int>._M_i != 0) &&
     ((w->remove_count).super___atomic_base<unsigned_int>._M_i == _Var4)) {
    pnVar10 = nsync_remove_from_mu_queue_(*(nsync_dll_list_ *)(this + 8),&(w->nw).q);
    *(nsync_dll_list_ *)(this + 8) = pnVar10;
    (w->nw).waiting.super___atomic_base<unsigned_int>._M_i = 0;
    uVar13 = uVar13 + l_type->add_to_acquire;
    bVar12 = true;
    local_6c = iVar5;
  }
  *(uint *)this = uVar13;
LAB_00105f03:
  if ((w->nw).waiting.super___atomic_base<unsigned_int>._M_i != 0) {
    uVar7 = nsync_spin_delay_(uVar7);
  }
  if ((w->nw).waiting.super___atomic_base<unsigned_int>._M_i == 0) goto LAB_00106007;
  goto LAB_00105eff;
LAB_00106007:
  bVar12 = !bVar12;
LAB_00106016:
  if (bVar12) {
    nsync_mu_lock_slow_((nsync_mu *)this,w,8,l_type);
  }
  if (mu == (nsync_mu *)0x0) {
    bVar14 = true;
  }
  else {
    iVar5 = (*(code *)mu)(condition);
    bVar14 = iVar5 != 0;
  }
  bVar12 = true;
  if (bVar14 || local_6c != 0) goto code_r0x0010605d;
  goto LAB_00105dc7;
code_r0x0010605d:
  iVar5 = 0;
  if (!bVar14) {
    iVar5 = local_6c;
  }
  goto LAB_00106065;
}

Assistant:

int nsync_mu_wait_with_deadline (nsync_mu *mu,
				 int (*condition) (const void *condition_arg),
				 const void *condition_arg,
				 int (*condition_arg_eq) (const void *a, const void *b),
				 nsync_time abs_deadline, nsync_note cancel_note) {
	lock_type *l_type;
	int first_wait;
	int condition_is_true;
	waiter *w;
	int outcome;
	/* Work out in which mode the lock is held. */
	uint32_t old_word;
	IGNORE_RACES_START ();
	old_word = ATM_LOAD (&mu->word);
	if ((old_word & MU_ANY_LOCK) == 0) {
		nsync_panic_ ("nsync_mu not held in some mode when calling "
		       "nsync_mu_wait_with_deadline()\n");
	}
	l_type = nsync_writer_type_;
	if ((old_word & MU_RHELD_IF_NON_ZERO) != 0) {
		l_type = nsync_reader_type_;
	}

	first_wait = 1; /* first time through the loop below. */
	condition_is_true = (condition == NULL || (*condition) (condition_arg));

	/* Loop until either the condition becomes true, or "outcome" indicates
	   cancellation or timeout. */
	w = NULL;
	outcome = 0;
	while (outcome == 0 && !condition_is_true) {
		uint32_t has_condition;
		uint32_t remove_count;
		uint32_t add_to_acquire;
		int had_waiters;
		int sem_outcome;
		unsigned attempts;
		int have_lock;
		if (w == NULL) {
			w = nsync_waiter_new_ (); /* get a waiter struct if we need one. */
		}

		/* Prepare to wait. */
		w->cv_mu = NULL; /* not a condition variable wait */
		w->l_type = l_type;
		w->cond.f = condition;
		w->cond.v = condition_arg;
		w->cond.eq = condition_arg_eq;
		has_condition = 0; /* set to MU_CONDITION if condition is non-NULL */
		if (condition != NULL) {
			has_condition = MU_CONDITION;
		}
		ATM_STORE (&w->nw.waiting, 1);
		remove_count = ATM_LOAD (&w->remove_count);

		/* Acquire spinlock. */
		old_word = nsync_spin_test_and_set_ (&mu->word, MU_SPINLOCK,
			MU_SPINLOCK|MU_WAITING|has_condition, MU_ALL_FALSE);
		had_waiters = ((old_word & (MU_DESIG_WAKER | MU_WAITING)) == MU_WAITING);
		/* Queue the waiter. */
		if (first_wait) {
			nsync_maybe_merge_conditions_ (nsync_dll_last_ (mu->waiters),
						       &w->nw.q);
			/* first wait goes to end of queue */
			mu->waiters = nsync_dll_make_last_in_list_ (mu->waiters,
							            &w->nw.q);
			first_wait = 0;
		} else {
			nsync_maybe_merge_conditions_ (&w->nw.q,
						       nsync_dll_first_ (mu->waiters));
			/* subsequent waits go to front of queue */
			mu->waiters = nsync_dll_make_first_in_list_ (mu->waiters,
							             &w->nw.q);
		}
		/* Release spinlock and *mu. */
		RWLOCK_RELEASE (mu, l_type == nsync_writer_type_);
		do {
			old_word = ATM_LOAD (&mu->word);
			add_to_acquire = l_type->add_to_acquire;
			if (((old_word-l_type->add_to_acquire)&MU_ANY_LOCK) == 0 && had_waiters) {
				add_to_acquire = 0; /* release happens in nsync_mu_unlock_slow_ */
			}
		} while (!ATM_CAS_REL (&mu->word, old_word,
				       (old_word - add_to_acquire) & ~MU_SPINLOCK));
		if (add_to_acquire == 0) {
			/* The lock will be fully released, there are waiters, and
			   no designated waker, so wake waiters. */
			nsync_mu_unlock_slow_ (mu, l_type);
		}

		/* wait until awoken or a timeout. */
		sem_outcome = 0;
		attempts = 0;
		have_lock = 0;
		while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
			if (sem_outcome == 0) {
				sem_outcome = nsync_sem_wait_with_cancel_ (w, abs_deadline,
									   cancel_note);
				if (sem_outcome != 0 && ATM_LOAD (&w->nw.waiting) != 0) {
					/* A timeout or cancellation occurred, and no wakeup.
					   Acquire the spinlock and mu, and confirm. */
					have_lock = mu_try_acquire_after_timeout_or_cancel (
						mu, l_type, w, remove_count);
					if (have_lock) { /* Successful acquire. */
						outcome = sem_outcome;
					}
				}
			}

			if (ATM_LOAD (&w->nw.waiting) != 0) {
				attempts = nsync_spin_delay_ (attempts); /* will ultimately yield */
			}
		}

		if (!have_lock) {
			/* If we didn't reacquire due to a cancellation/timeout, acquire now. */
			nsync_mu_lock_slow_ (mu, w, MU_DESIG_WAKER, l_type);
			RWLOCK_TRYACQUIRE (1, mu, l_type == nsync_writer_type_);
		}
		condition_is_true = (condition == NULL || (*condition) (condition_arg));
	}
	if (w != NULL) {
		nsync_waiter_free_ (w); /* free waiter if we allocated one. */
	}
	if (condition_is_true) {
		outcome = 0; /* condition is true trumps other outcomes. */
	}
	IGNORE_RACES_END ();
	return (outcome);
}